

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::array<unsigned_char,_5UL>_&> * __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::array<unsigned_char,_5UL>_&> *__return_storage_ptr__,
          ElementsAreMatcher *this)

{
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>_>
  bVar1;
  ElementsAreMatcherImpl<std::array<unsigned_char,5ul>const&> *this_00;
  iterator first;
  iterator last;
  undefined1 local_30 [8];
  MatcherVec matchers;
  ElementsAreMatcher<std::tuple<unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>_>
  *this_local;
  
  matchers.
  super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
  ::vector((vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
            *)local_30);
  std::
  vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
  ::reserve((vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             *)local_30,5);
  bVar1 = std::
          back_inserter<std::vector<testing::Matcher<unsigned_char_const&>,std::allocator<testing::Matcher<unsigned_char_const&>>>>
                    ((vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                      *)local_30);
  TransformTupleValues<std::tuple<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>,testing::internal::CastAndAppendTransform<unsigned_char_const&>,std::back_insert_iterator<std::vector<testing::Matcher<unsigned_char_const&>,std::allocator<testing::Matcher<unsigned_char_const&>>>>>
            (this,bVar1.container);
  this_00 = (ElementsAreMatcherImpl<std::array<unsigned_char,5ul>const&> *)operator_new(0x20);
  first = std::
          vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
          ::begin((vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                   *)local_30);
  last = std::
         vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
         ::end((vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                *)local_30);
  ElementsAreMatcherImpl<std::array<unsigned_char,5ul>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<unsigned_char_const&>*,std::vector<testing::Matcher<unsigned_char_const&>,std::allocator<testing::Matcher<unsigned_char_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_unsigned_char_&>_*,_std::vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>_>
                      )first._M_current,
             (__normal_iterator<testing::Matcher<const_unsigned_char_&>_*,_std::vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>_>
              )last._M_current);
  Matcher<const_std::array<unsigned_char,_5UL>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::array<unsigned_char,_5UL>_&> *)this_00);
  std::
  vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
  ::~vector((vector<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    GTEST_COMPILE_ASSERT_(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        use_UnorderedElementsAre_with_hash_tables);

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&> > MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }